

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Filter.cpp
# Opt level: O2

void __thiscall nv::Kernel2::Kernel2(Kernel2 *this,Kernel2 *k)

{
  uint uVar1;
  float *pfVar2;
  float *pfVar3;
  uint i;
  ulong uVar4;
  
  uVar1 = k->m_windowSize;
  this->m_windowSize = uVar1;
  pfVar3 = (float *)operator_new__((ulong)(uVar1 * uVar1) * 4);
  this->m_data = pfVar3;
  pfVar2 = k->m_data;
  for (uVar4 = 0; uVar1 * uVar1 != uVar4; uVar4 = uVar4 + 1) {
    pfVar3[uVar4] = pfVar2[uVar4];
  }
  return;
}

Assistant:

Kernel2::Kernel2(const Kernel2 & k) : m_windowSize(k.m_windowSize)
{
	m_data = new float[m_windowSize * m_windowSize];
	for (uint i = 0; i < m_windowSize * m_windowSize; i++) {
		m_data[i] = k.m_data[i];
	}
}